

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testInvalid_OnlyTarget(void)

{
  Rep *pRVar1;
  bool bVar2;
  NeuralNetwork *nn;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  ostream *poVar7;
  int i;
  int iVar8;
  long lVar9;
  void **ppvVar10;
  Model spec;
  TensorAttributes tensorAttributesOut;
  FeatureDescription feature;
  string targetName;
  Result res;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_d8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_a8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_78;
  TensorAttributes tensorAttributesIn;
  
  CoreML::Specification::Model::Model(&spec);
  CoreML::Result::Result(&res);
  tensorAttributesIn.name = "InTensor";
  tensorAttributesIn.dimension = 3;
  tensorAttributesIn._12_4_ = 0;
  tensorAttributesOut.name = "OutTensor";
  tensorAttributesOut.dimension = 1;
  tensorAttributesOut._12_4_ = 0;
  buildBasicNeuralNetworkModel
            (&spec,true,&tensorAttributesIn,&tensorAttributesOut,0x400,false,false);
  spec.specificationversion_ = 4;
  nn = CoreML::Specification::Model::mutable_neuralnetwork(&spec);
  addSoftmaxLayer(&spec,"softmax","OutTensor","softmax_out");
  std::__cxx11::string::string((string *)&targetName,"cce_target",(allocator *)&feature);
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            (&spec,nn,"cross_entropy_loss_layer","softmax_out",targetName._M_dataplus._M_p);
  addLearningRate<CoreML::Specification::NeuralNetwork>(nn,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl._0_8_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (nn,kSgdOptimizer,10,5,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_78);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_78);
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl._0_8_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  addEpochs<CoreML::Specification::NeuralNetwork>
            (nn,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_a8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_a8);
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl._0_8_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (nn,0x7e3,0,0x7e3,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_d8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_d8);
  pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(pMVar3->traininginput_).super_RepeatedPtrFieldBase);
  pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->traininginput_);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,&targetName);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  pAVar6->datatype_ = 0x20020;
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,1);
  CoreML::Model::validate((Result *)&feature,&spec);
  CoreML::Result::operator=(&res,(Result *)&feature);
  std::__cxx11::string::~string((string *)&feature._internal_metadata_);
  bVar2 = CoreML::Result::good(&res);
  if (bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x5ca);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"!((res).good())");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar8 = 1;
  }
  else {
    pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
    google::protobuf::internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
              (&(pMVar3->output_).super_RepeatedPtrFieldBase);
    pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
    pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                       (&pMVar3->output_);
    CoreML::Specification::FeatureDescription::set_name(pFVar4,tensorAttributesOut.name);
    pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
    pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
    pAVar6->datatype_ = 0x10020;
    for (iVar8 = 0; iVar8 < tensorAttributesOut.dimension; iVar8 = iVar8 + 1) {
      CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,1);
    }
    if (spec.description_ == (ModelDescription *)0x0) {
      spec.description_ =
           (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar1 = ((spec.description_)->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar10 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      ppvVar10 = (void **)0x0;
    }
    iVar8 = ((spec.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar9 = 0; (long)iVar8 * 8 != lVar9; lVar9 = lVar9 + 8) {
      CoreML::Specification::FeatureDescription::FeatureDescription
                (&feature,*(FeatureDescription **)((long)ppvVar10 + lVar9));
      pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
      pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                         (&pMVar3->traininginput_);
      CoreML::Specification::FeatureDescription::CopyFrom(pFVar4,&feature);
      CoreML::Specification::FeatureDescription::~FeatureDescription(&feature);
    }
    CoreML::Model::validate((Result *)&feature,&spec);
    CoreML::Result::operator=(&res,(Result *)&feature);
    std::__cxx11::string::~string((string *)&feature._internal_metadata_);
    bVar2 = CoreML::Result::good(&res);
    iVar8 = 0;
    if (!bVar2) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x5db);
      poVar7 = std::operator<<(poVar7,": error: ");
      poVar7 = std::operator<<(poVar7,"(res).good()");
      poVar7 = std::operator<<(poVar7," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar7);
      iVar8 = 1;
    }
  }
  std::__cxx11::string::~string((string *)&targetName);
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&spec);
  return iVar8;
}

Assistant:

int testInvalid_OnlyTarget() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    std::string targetName = "cce_target";
    addCategoricalCrossEntropyLoss(spec, neuralNet, "cross_entropy_loss_layer", "softmax_out", targetName.c_str());

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    // Clearing and then specifically adding only the target as a training input
    spec.mutable_description()->clear_traininginput();

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(targetName);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    // Remove predictedFeatureName from model's outputs and add model's inputs to training inputs
    spec.mutable_description()->clear_output();
    auto outTensor = spec.mutable_description()->add_output();
    outTensor->set_name(tensorAttributesOut.name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < tensorAttributesOut.dimension; i++) {
        outTensorShape->add_shape(1);
    }

    for (auto feature : spec.description().input()) {
        auto trainingInputModel = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInputModel->CopyFrom(feature);
    }
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);    return 0;
}